

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_1.cpp
# Opt level: O0

int main(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  int local_18;
  int local_14;
  int j;
  int i;
  int N;
  
  i = 0;
  __isoc99_scanf("%d",&j);
  for (local_14 = 0; local_14 < j; local_14 = local_14 + 1) {
    __isoc99_scanf("%lf",num + local_14);
  }
  std::sort<double*,bool(*)(double,double)>(num,num + j,cmp);
  for (local_18 = 0; local_18 < j; local_18 = local_18 + 1) {
    if (local_18 == j + -1) {
      _Var1 = std::setprecision(6);
      poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
      std::ostream::operator<<(poVar2,num[local_18]);
    }
    else {
      std::ios_base::setf((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_fixed);
      _Var1 = std::setprecision(6);
      poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,num[local_18]);
      std::operator<<(poVar2," ");
    }
  }
  return 0;
}

Assistant:

int main()
{
    int N;
    scanf("%d",&N);
    for (int i = 0; i < N; ++i) {
        scanf("%lf",&num[i]);

    }
    sort(num,num + N,cmp);
    for (int j = 0; j < N; ++j) {
        if(j != N - 1)
        {
            //printf("%.6lf ",num[j]);
            cout.setf(ios::fixed);          //fixed表示不带指数域，若要用指数域则使用scientific
            cout << setprecision(6) << num[j] << " ";
        }
        else
            //printf("%.6lf",num[j]);
            cout << setprecision(6) << num[j];
    }
    return 0;
}